

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_impl.c
# Opt level: O1

int log_impl_destroy(log_impl impl)

{
  int iVar1;
  long lVar2;
  
  if (impl != (log_impl)0x0) {
    lVar2 = 2;
    do {
      if (impl->aspects[lVar2 + -2] != (log_aspect)0x0) {
        log_aspect_destroy(impl->aspects[lVar2 + -2]);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    iVar1 = log_handle_destroy(impl->handle);
    free(impl);
    return iVar1;
  }
  return 0;
}

Assistant:

int log_impl_destroy(log_impl impl)
{
	if (impl != NULL)
	{
		int result;

		size_t iterator;

		for (iterator = 0; iterator < LOG_ASPECT_SIZE; ++iterator)
		{
			if (impl->aspects[iterator] != NULL)
			{
				log_aspect_destroy(impl->aspects[iterator]);
			}
		}

		result = log_handle_destroy(impl->handle);

		free(impl);

		return result;
	}

	return 0;
}